

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

bool testing::internal::FindPairing(MatchMatrix *matrix,MatchResultListener *listener)

{
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  MatchResultListener *pMVar4;
  ostream *stream;
  reference pvVar5;
  ulong local_78;
  size_t mi;
  char *sep;
  size_t local_60 [3];
  undefined1 local_41;
  size_type sStack_40;
  bool result;
  size_t max_flow;
  ElementMatcherPairs matches;
  MatchResultListener *listener_local;
  MatchMatrix *matrix_local;
  
  matches.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)listener;
  FindMaxBipartiteMatching((ElementMatcherPairs *)&max_flow,matrix);
  sVar2 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::size((ElementMatcherPairs *)&max_flow);
  sStack_40 = sVar2;
  sVar3 = MatchMatrix::RhsSize(matrix);
  local_41 = sVar2 == sVar3;
  if ((bool)local_41) {
    sVar2 = std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::size((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)&max_flow);
    if ((1 < sVar2) &&
       (bVar1 = MatchResultListener::IsInterested
                          ((MatchResultListener *)
                           matches.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
      mi = (size_t)anon_var_dwarf_9a8b2;
      for (local_78 = 0;
          sVar2 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::size((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          *)&max_flow), local_78 < sVar2; local_78 = local_78 + 1) {
        pMVar4 = MatchResultListener::operator<<
                           ((MatchResultListener *)
                            matches.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(char **)&mi);
        pMVar4 = MatchResultListener::operator<<(pMVar4,(char (*) [13])" - element #");
        pvVar5 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               *)&max_flow,local_78);
        pMVar4 = MatchResultListener::operator<<(pMVar4,&pvVar5->first);
        pMVar4 = MatchResultListener::operator<<(pMVar4,(char (*) [25])" is matched by matcher #");
        pvVar5 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               *)&max_flow,local_78);
        MatchResultListener::operator<<(pMVar4,&pvVar5->second);
        mi = (size_t)anon_var_dwarf_98428;
      }
    }
    matrix_local._7_1_ = true;
  }
  else {
    bVar1 = MatchResultListener::IsInterested
                      ((MatchResultListener *)
                       matches.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      pMVar4 = MatchResultListener::operator<<
                         ((MatchResultListener *)
                          matches.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (char (*) [89])
                          "where no permutation of the elements can satisfy all matchers, and the closest match is "
                         );
      pMVar4 = MatchResultListener::operator<<(pMVar4,&stack0xffffffffffffffc0);
      pMVar4 = MatchResultListener::operator<<(pMVar4,(char (*) [5])0x25fb01);
      local_60[0] = MatchMatrix::RhsSize(matrix);
      pMVar4 = MatchResultListener::operator<<(pMVar4,local_60);
      MatchResultListener::operator<<(pMVar4,(char (*) [30])" matchers with the pairings:\n");
      stream = MatchResultListener::stream
                         ((MatchResultListener *)
                          matches.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      LogElementMatcherPairVec((ElementMatcherPairs *)&max_flow,stream);
    }
    matrix_local._7_1_ = false;
  }
  sep._4_4_ = 1;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)&max_flow);
  return matrix_local._7_1_;
}

Assistant:

GTEST_API_ bool FindPairing(const MatchMatrix& matrix,
                            MatchResultListener* listener) {
  ElementMatcherPairs matches = FindMaxBipartiteMatching(matrix);

  size_t max_flow = matches.size();
  bool result = (max_flow == matrix.RhsSize());

  if (!result) {
    if (listener->IsInterested()) {
      *listener << "where no permutation of the elements can "
                   "satisfy all matchers, and the closest match is "
                << max_flow << " of " << matrix.RhsSize()
                << " matchers with the pairings:\n";
      LogElementMatcherPairVec(matches, listener->stream());
    }
    return false;
  }

  if (matches.size() > 1) {
    if (listener->IsInterested()) {
      const char *sep = "where:\n";
      for (size_t mi = 0; mi < matches.size(); ++mi) {
        *listener << sep << " - element #" << matches[mi].first
                  << " is matched by matcher #" << matches[mi].second;
        sep = ",\n";
      }
    }
  }
  return true;
}